

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O0

Metadata * __thiscall r_comp::Metadata::getObjectName_abi_cxx11_(Metadata *this,uint16_t index)

{
  bool bVar1;
  pointer pvVar2;
  ushort in_DX;
  undefined6 in_register_00000032;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
  local_28;
  const_iterator r;
  uint16_t index_local;
  Metadata *this_local;
  string *s;
  
  r.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
  ._M_cur._6_2_ = in_DX;
  std::__detail::
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_false,_true>
              *)&local_28);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>_>
                *)(CONCAT62(in_register_00000032,index) + 0x70));
  local_28._M_cur = local_30._M_cur;
  while( true ) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>_>
                *)(CONCAT62(in_register_00000032,index) + 0x70));
    bVar1 = std::__detail::operator!=(&local_28,&local_38);
    if (!bVar1) {
      std::__cxx11::string::string((string *)this);
      return this;
    }
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_false,_true>
                           *)&local_28);
    if ((pvVar2->second).index ==
        (ulong)r.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
               ._M_cur._6_2_) break;
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_false,_true>
                  *)&local_28);
  }
  pvVar2 = std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_false,_true>
           ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_false,_true>
                         *)&local_28);
  std::__cxx11::string::string((string *)this,(string *)pvVar2);
  return this;
}

Assistant:

std::string Metadata::getObjectName(const uint16_t index) const
{
    std::unordered_map<std::string, Reference>::const_iterator r;

    for (r = global_references.begin(); r != global_references.end(); ++r) {
        if (r->second.index == index) {
            return r->first;
        }
    }

    std::string s;
    return s;
}